

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsGraph.h
# Opt level: O1

bool __thiscall
dg::vr::RelationsGraph<dg::vr::ValueRelations>::addRelation
          (RelationsGraph<dg::vr::ValueRelations> *this,Bucket *lt,Type type,Bucket *rt,
          Relations *maybeBetween)

{
  pointer prVar1;
  bool bVar2;
  Bucket *rt_00;
  bool bVar3;
  Type TVar4;
  Type type_00;
  Relations between_1;
  ulong uVar5;
  Relations RVar6;
  Bucket *pBVar7;
  byte unaff_BPL;
  pointer prVar8;
  long lVar9;
  Relations between;
  BucketSet intersect;
  _Base_bitset<1UL> local_68;
  Bucket *local_60;
  Bucket *local_58;
  RelationsGraph<dg::vr::ValueRelations> *local_50;
  BucketSet local_48;
  
  if (maybeBetween == (Relations *)0x0) {
    local_68._M_w = (_WordT)relationsBetween(this,lt,rt);
  }
  else {
    local_68._M_w = (maybeBetween->bits).super__Base_bitset<1UL>._M_w;
  }
  if ((local_68._M_w >> ((ulong)type & 0x3f) & 1) != 0) {
    unaff_BPL = 0;
    goto LAB_001245bd;
  }
  switch(type) {
  case EQ:
    prVar8 = (lt->relatedBuckets)._M_elems[10].vec.
             super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((prVar8 != (lt->relatedBuckets)._M_elems[10].vec.
                   super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish) &&
       (prVar1 = (rt->relatedBuckets)._M_elems[10].vec.
                 super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                 ._M_impl.super__Vector_impl_data._M_start,
       prVar1 != (rt->relatedBuckets)._M_elems[10].vec.
                 super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish)) {
      addRelation(this,prVar8->_M_data,EQ,prVar1->_M_data,(Relations *)0x0);
    }
    bVar3 = setEqual(this,lt,rt);
    return bVar3;
  case NE:
    local_48.vec.
    super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x500000003;
    local_48.vec.
    super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x900000007;
    bVar3 = false;
    lVar9 = 0;
    local_60 = lt;
    local_58 = rt;
    local_50 = this;
    do {
      TVar4 = *(Type *)((long)&local_48.vec.
                               super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                               ._M_impl.super__Vector_impl_data._M_start + lVar9);
      RVar6 = relationsBetween(this,local_60,local_58);
      if (((ulong)RVar6.bits.super__Base_bitset<1UL>._M_w >> ((ulong)TVar4 & 0x3f) & 1) == 0) {
        uVar5 = dg::vr::Relations::getNonStrict(TVar4);
        if ((local_68._M_w >> (uVar5 & 0x3f) & 1) == 0) {
          bVar2 = true;
        }
        else {
          type_00 = dg::vr::Relations::getNonStrict(TVar4);
          rt_00 = local_58;
          pBVar7 = local_60;
          unsetRelated(local_60,type_00,local_58);
          this = local_50;
          unaff_BPL = addRelation(local_50,pBVar7,TVar4,rt_00,(Relations *)&local_68);
          bVar2 = false;
        }
      }
      else {
        bVar2 = false;
        unaff_BPL = 0;
      }
      if (!bVar2) break;
      lVar9 = lVar9 + 4;
      bVar3 = lVar9 == 0x10;
    } while (!bVar3);
    rt = local_58;
    lt = local_60;
    if (!bVar3) goto LAB_001245bd;
    break;
  case SLE:
  case ULE:
    if ((local_68._M_w & 2) != 0) {
      unsetRelated(lt,NE,rt);
      TVar4 = dg::vr::Relations::getStrict(type);
      pBVar7 = rt;
      rt = lt;
      goto LAB_00124391;
    }
    uVar5 = dg::vr::Relations::inverted(type);
    if ((local_68._M_w >> (uVar5 & 0x3f) & 1) == 0) break;
    TVar4 = dg::vr::Relations::inverted(type);
    getIntersectingNonstrict(&local_48,this,lt,rt,TVar4);
    prVar8 = local_48.vec.
             super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
             ._M_impl.super__Vector_impl_data._M_start + 1;
    if (prVar8 != local_48.vec.
                  super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      pBVar7 = (local_48.vec.
                super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->_M_data;
      do {
        setEqual(this,pBVar7,prVar8->_M_data);
        prVar8 = prVar8 + 1;
      } while (prVar8 != local_48.vec.
                         super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                         ._M_impl.super__Vector_impl_data._M_finish);
    }
    if (local_48.vec.
        super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_48.vec.
                      super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_48.vec.
                            super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.vec.
                            super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    goto LAB_001245ba;
  case SLT:
  case ULT:
    uVar5 = dg::vr::Relations::getNonStrict(type);
    if ((local_68._M_w >> (uVar5 & 0x3f) & 1) != 0) {
      TVar4 = dg::vr::Relations::getNonStrict(type);
      unsetRelated(lt,TVar4,rt);
    }
    if ((local_68._M_w & 2) != 0) {
      unsetRelated(lt,NE,rt);
    }
    break;
  case SGE:
  case SGT:
  case UGE:
  case UGT:
  case PF:
    dg::vr::Relations::invert();
    TVar4 = dg::vr::Relations::inverted(type);
    pBVar7 = lt;
LAB_00124391:
    unaff_BPL = addRelation(this,rt,TVar4,pBVar7,(Relations *)&local_68);
    goto LAB_001245bd;
  case PT:
    prVar8 = (lt->relatedBuckets)._M_elems[10].vec.
             super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if (prVar8 != (lt->relatedBuckets)._M_elems[10].vec.
                  super__Vector_base<std::reference_wrapper<dg::vr::Bucket>,_std::allocator<std::reference_wrapper<dg::vr::Bucket>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
      bVar3 = addRelation(this,prVar8->_M_data,EQ,rt,(Relations *)0x0);
      return bVar3;
    }
  }
  setRelated(lt,type,rt);
LAB_001245ba:
  unaff_BPL = 1;
LAB_001245bd:
  return (bool)(unaff_BPL & 1);
}

Assistant:

bool addRelation(const Bucket &lt, Relations::Type type, const Bucket &rt,
                     Relations *maybeBetween = nullptr) {
        Bucket &mLt = const_cast<Bucket &>(lt);
        Bucket &mRt = const_cast<Bucket &>(rt);

        Relations between = fromMaybeBetween(lt, rt, maybeBetween);
        if (areRelated(lt, type, rt, &between))
            return false;
        assert(!haveConflictingRelation(lt, type, rt, &between));

        switch (type) {
        case Relations::EQ:
            if (lt.hasRelation(Relations::PT) &&
                rt.hasRelation(Relations::PT)) {
                addRelation(lt.getRelated(Relations::PT), Relations::EQ,
                            rt.getRelated(Relations::PT));
            }
            return setEqual(mLt, mRt);

        case Relations::NE:
            for (Relations::Type rel : {Relations::SLT, Relations::ULT,
                                        Relations::SGT, Relations::UGT}) {
                if (areRelated(lt, rel, rt))
                    return false;
                if (areRelated(lt, Relations::getNonStrict(rel), rt,
                               &between)) {
                    unsetRelated(mLt, Relations::getNonStrict(rel), mRt);
                    return addRelation(lt, rel, rt, &between);
                }
            }
            break; // jump after switch

        case Relations::SLT:
        case Relations::ULT:
            if (areRelated(lt, Relations::getNonStrict(type), rt, &between))
                unsetRelated(mLt, Relations::getNonStrict(type), mRt);
            if (areRelated(lt, Relations::NE, rt, &between))
                unsetRelated(mLt, Relations::NE, mRt);
            break; // jump after switch

        case Relations::SLE:
        case Relations::ULE:
            if (areRelated(lt, Relations::NE, rt, &between)) {
                unsetRelated(mLt, Relations::NE, mRt);
                return addRelation(lt, Relations::getStrict(type), rt,
                                   &between);
            }
            if (areRelated(lt, Relations::inverted(type), rt, &between)) {
                Bucket::BucketSet intersect = getIntersectingNonstrict(
                        lt, rt, Relations::inverted(type));
                assert(intersect.size() >= 2);
                Bucket &first = *intersect.begin();
                for (auto it = std::next(intersect.begin());
                     it != intersect.end(); ++it)
                    setEqual(first, *it);
                return true;
            }
            break; // jump after switch

        case Relations::PT:
            if (lt.hasRelation(type))
                return addRelation(lt.getRelated(type), Relations::EQ, rt);
            break; // jump after switch

        case Relations::SGT:
        case Relations::SGE:
        case Relations::UGT:
        case Relations::UGE:
        case Relations::PF: {
            between.invert();
            return addRelation(rt, Relations::inverted(type), lt, &between);
        }
        }
        setRelated(mLt, type, mRt);
        return true;
    }